

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::doubletonEq
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt row,RowType rowType)

{
  double *pdVar1;
  double dVar2;
  double substLower;
  double substUpper;
  double dVar3;
  bool bVar4;
  HighsVarType HVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  HighsLp *pHVar9;
  pointer pHVar10;
  pointer pdVar11;
  pointer pdVar12;
  double newLower;
  Result RVar13;
  long lVar14;
  long lVar15;
  pointer piVar16;
  long lVar17;
  HighsVarType HVar18;
  long lVar19;
  long lVar20;
  int col;
  int iVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double newUpper;
  HighsCDouble HVar27;
  double local_88;
  HighsCDouble local_60;
  HighsMatrixSlice<HighsTripletListSlice> local_50;
  
  bVar4 = (this->analysis_).logging_on_;
  if (bVar4 == true) {
    HPresolveAnalysis::startPresolveRuleLog(&this->analysis_,9);
  }
  lVar14 = (long)(this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[row];
  piVar16 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (piVar16[lVar14] == -1) {
    piVar16 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  lVar20 = (long)piVar16[lVar14];
  pHVar9 = this->model;
  piVar16 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar6 = piVar16[lVar14];
  lVar19 = (long)iVar6;
  pHVar10 = (pHVar9->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
            _M_impl.super__Vector_impl_data._M_start;
  HVar18 = pHVar10[lVar19];
  col = piVar16[lVar20];
  lVar17 = (long)col;
  HVar5 = pHVar10[lVar17];
  lVar15 = lVar20;
  iVar21 = iVar6;
  if (HVar18 == kInteger) {
    if (HVar5 == kInteger) {
      pdVar11 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar25 = ABS(pdVar11[lVar14]);
      dVar26 = ABS(pdVar11[lVar20]);
      dVar2 = (this->options->super_HighsOptionsStruct).small_matrix_value;
      if ((dVar25 < dVar26 - dVar2) ||
         ((dVar25 - dVar2 <= dVar26 &&
          (piVar16 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start, piVar16[lVar19] < piVar16[lVar17]))))
      goto LAB_00307b76;
    }
    goto LAB_00307b70;
  }
  if (HVar5 != kInteger) {
    piVar16 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar7 = piVar16[lVar19];
    if (iVar7 != 1) {
      iVar8 = piVar16[lVar17];
      if (iVar8 != 1) {
        pdVar11 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar2 = ABS(pdVar11[lVar14]);
        dVar25 = ABS(pdVar11[lVar20]);
        if (iVar7 != iVar8) {
          dVar26 = dVar25;
          if (dVar25 <= dVar2) {
            dVar26 = dVar2;
          }
          dVar24 = dVar25;
          if (dVar2 <= dVar25) {
            dVar24 = dVar2;
          }
          if (dVar26 <= dVar24 + dVar24) {
            if (iVar7 < iVar8) goto LAB_00307b76;
            goto LAB_00307b70;
          }
        }
        if (dVar25 < dVar2) goto LAB_00307b76;
      }
LAB_00307b70:
      lVar15 = lVar14;
      lVar19 = lVar17;
      lVar14 = lVar20;
      HVar18 = HVar5;
      iVar21 = col;
      col = iVar6;
    }
  }
LAB_00307b76:
  pdVar11 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar2 = pdVar11[lVar14];
  dVar25 = pdVar11[lVar15];
  dVar26 = (pHVar9->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[row];
  local_88 = dVar26;
  dVar24 = dVar25;
  if ((HVar18 == kInteger) && (pHVar10[col] == kInteger)) {
    dVar24 = round(dVar25 / dVar2);
    dVar24 = dVar24 * dVar2;
    pdVar1 = &(this->options->super_HighsOptionsStruct).small_matrix_value;
    if (*pdVar1 <= ABS(dVar24 - dVar25) && ABS(dVar24 - dVar25) != *pdVar1) {
      return kOk;
    }
    local_88 = round(dVar26 / dVar2);
    local_88 = local_88 * dVar2;
    if (this->primal_feastol <= ABS(dVar26 - local_88) &&
        ABS(dVar26 - local_88) != this->primal_feastol) {
      return kPrimalInfeasible;
    }
  }
  pdVar11 = (pHVar9->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (pHVar9->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar25 = pdVar11[col];
  dVar26 = pdVar12[col];
  substLower = pdVar11[lVar19];
  substUpper = pdVar12[lVar19];
  if ((long)((ulong)dVar24 ^ (ulong)dVar2) < 0) {
    newLower = -INFINITY;
    if (-INFINITY < substLower) {
      local_60.hi = local_88;
      local_60.lo = 0.0;
      HVar27 = HighsCDouble::operator-(&local_60,dVar2 * substLower);
      local_50.nodeIndex = (HighsInt *)HVar27.hi;
      local_50.nodeValue = (double *)HVar27.lo;
      HVar27 = HighsCDouble::operator/((HighsCDouble *)&local_50,dVar24);
      newLower = HVar27.lo + HVar27.hi;
    }
    newUpper = INFINITY;
    dVar3 = substUpper;
    if (INFINITY <= substUpper) goto LAB_00307e51;
  }
  else {
    newLower = -INFINITY;
    if (substUpper < INFINITY) {
      local_60.hi = local_88;
      local_60.lo = 0.0;
      HVar27 = HighsCDouble::operator-(&local_60,dVar2 * substUpper);
      local_50.nodeIndex = (HighsInt *)HVar27.hi;
      local_50.nodeValue = (double *)HVar27.lo;
      HVar27 = HighsCDouble::operator/((HighsCDouble *)&local_50,dVar24);
      newLower = HVar27.lo + HVar27.hi;
    }
    dVar3 = substLower;
    if (substLower <= -INFINITY) {
      newUpper = INFINITY;
      goto LAB_00307e51;
    }
  }
  local_60.hi = local_88;
  local_60.lo = 0.0;
  HVar27 = HighsCDouble::operator-(&local_60,dVar2 * dVar3);
  local_50.nodeIndex = (HighsInt *)HVar27.hi;
  local_50.nodeValue = (double *)HVar27.lo;
  HVar27 = HighsCDouble::operator/((HighsCDouble *)&local_50,dVar24);
  newUpper = HVar27.lo + HVar27.hi;
LAB_00307e51:
  dVar3 = this->primal_feastol;
  uVar22 = SUB84(dVar3,0);
  uVar23 = (undefined4)((ulong)dVar3 >> 0x20);
  dVar25 = dVar25 + dVar3;
  if (dVar25 < newLower) {
    changeColLower(this,col,newLower);
    uVar22 = SUB84(this->primal_feastol,0);
    uVar23 = (undefined4)((ulong)this->primal_feastol >> 0x20);
  }
  dVar26 = dVar26 - (double)CONCAT44(uVar23,uVar22);
  if (newUpper < dVar26) {
    changeColUpper(this,col,newUpper);
  }
  local_50.nodeValue =
       (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_50.nodeIndex =
       (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_50.nodeNext =
       (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_50.head =
       (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start[lVar19];
  HighsPostsolveStack::doubletonEquation<HighsTripletListSlice>
            (postsolve_stack,row,iVar21,col,dVar2,dVar24,local_88,substLower,substUpper,
             (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar19],dVar25 < newLower,newUpper < dVar26,rowType,
             &local_50);
  (this->changedColFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[lVar19] = '\x01';
  (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[lVar19] = '\x01';
  this->numDeletedCols = this->numDeletedCols + 1;
  removeRow(this,row);
  substitute(this,iVar21,col,local_88 / dVar2,-dVar24 / dVar2);
  (this->analysis_).logging_on_ = bVar4;
  if (bVar4 != false) {
    HPresolveAnalysis::stopPresolveRuleLog(&this->analysis_,9);
  }
  RVar13 = removeRowSingletons(this,postsolve_stack);
  if (RVar13 == kOk) {
    RVar13 = checkLimits(this,postsolve_stack);
  }
  return RVar13;
}

Assistant:

HPresolve::Result HPresolve::doubletonEq(HighsPostsolveStack& postsolve_stack,
                                         HighsInt row,
                                         HighsPostsolveStack::RowType rowType) {
  assert(analysis_.allow_rule_[kPresolveRuleDoubletonEquation]);
  const bool logging_on = analysis_.logging_on_;
  if (logging_on)
    analysis_.startPresolveRuleLog(kPresolveRuleDoubletonEquation);
  assert(!rowDeleted[row]);
  assert(rowsize[row] == 2);
  assert(model->row_lower_[row] == model->row_upper_[row]);

  // printf("doubleton equation: ");
  // debugPrintRow(row);
  HighsInt nzPos1 = rowroot[row];
  HighsInt nzPos2 = ARright[nzPos1] != -1 ? ARright[nzPos1] : ARleft[nzPos1];

  auto colAtPos1Better = [&]() {
    if (model->integrality_[Acol[nzPos1]] == HighsVarType::kInteger) {
      if (model->integrality_[Acol[nzPos2]] == HighsVarType::kInteger) {
        // both columns integer. For substitution choose smaller absolute
        // coefficient value, or sparser column if values are equal
        if (std::fabs(Avalue[nzPos1]) <
            std::fabs(Avalue[nzPos2]) - options->small_matrix_value) {
          return true;
        } else if (std::fabs(Avalue[nzPos2]) <
                   std::fabs(Avalue[nzPos1]) - options->small_matrix_value) {
          return false;
        } else if (colsize[Acol[nzPos1]] < colsize[Acol[nzPos2]]) {
          return true;
        } else {
          return false;
        }
      } else {
        // one col is integral, substitute the continuous one
        return false;
      }
    } else {
      if (model->integrality_[Acol[nzPos2]] == HighsVarType::kInteger) {
        // one col is integral, substitute the continuous one
        return true;
      } else {
        // both columns continuous the one with a larger absolute coefficient
        // value if the difference is more than factor 2, and otherwise the one
        // with fewer nonzeros if those are equal
        HighsInt col1Size = colsize[Acol[nzPos1]];
        if (col1Size == 1)
          return true;
        else {
          HighsInt col2Size = colsize[Acol[nzPos2]];
          if (col2Size == 1)
            return false;
          else {
            double abs1Val = std::fabs(Avalue[nzPos1]);
            double abs2Val = std::fabs(Avalue[nzPos2]);
            if (col1Size != col2Size &&
                std::max(abs1Val, abs2Val) <= 2.0 * std::min(abs1Val, abs2Val))
              return (col1Size < col2Size);
            else if (abs1Val > abs2Val)
              return true;
            else
              return false;
          }
        }
      }
    }
  };

  HighsInt substcol;
  HighsInt staycol;
  double substcoef;
  double staycoef;

  if (colAtPos1Better()) {
    substcol = Acol[nzPos1];
    staycol = Acol[nzPos2];

    substcoef = Avalue[nzPos1];
    staycoef = Avalue[nzPos2];
  } else {
    substcol = Acol[nzPos2];
    staycol = Acol[nzPos1];

    substcoef = Avalue[nzPos2];
    staycoef = Avalue[nzPos1];
  }

  double rhs = model->row_upper_[row];
  if (model->integrality_[substcol] == HighsVarType::kInteger &&
      model->integrality_[staycol] == HighsVarType::kInteger) {
    // check integrality conditions
    double roundCoef = std::round(staycoef / substcoef) * substcoef;
    if (std::fabs(roundCoef - staycoef) > options->small_matrix_value)
      return Result::kOk;
    staycoef = roundCoef;
    double roundRhs = std::round(rhs / substcoef) * substcoef;
    if (std::fabs(rhs - roundRhs) > primal_feastol)
      return Result::kPrimalInfeasible;
    rhs = roundRhs;
  }

  double oldStayLower = model->col_lower_[staycol];
  double oldStayUpper = model->col_upper_[staycol];
  double substLower = model->col_lower_[substcol];
  double substUpper = model->col_upper_[substcol];

  double stayImplLower;
  double stayImplUpper;
  if (std::signbit(substcoef) != std::signbit(staycoef)) {
    // coefficients have the opposite sign, therefore the implied lower bound of
    // the stay column is computed from the lower bound of the substituted
    // column:
    // staycol * staycoef + substcol * substcoef = rhs
    // staycol = (rhs - substcol * substcoef) / staycoef
    // staycol >= rhs / staycoef + lower(-substcoef/staycoef * substcol)
    // lower(-substcoef/staycoef * substcol) is (-substcoef/staycoef) *
    // substLower if (-substcoef/staycoef) is positive, i.e. if the coefficients
    // have opposite sign
    stayImplLower = substLower == -kHighsInf
                        ? -kHighsInf
                        : static_cast<double>((static_cast<HighsCDouble>(rhs) -
                                               substcoef * substLower) /
                                              staycoef);
    stayImplUpper = substUpper == kHighsInf
                        ? kHighsInf
                        : static_cast<double>((static_cast<HighsCDouble>(rhs) -
                                               substcoef * substUpper) /
                                              staycoef);
  } else {
    stayImplLower = substUpper == kHighsInf
                        ? -kHighsInf
                        : static_cast<double>((static_cast<HighsCDouble>(rhs) -
                                               substcoef * substUpper) /
                                              staycoef);
    stayImplUpper = substLower == -kHighsInf
                        ? kHighsInf
                        : static_cast<double>((static_cast<HighsCDouble>(rhs) -
                                               substcoef * substLower) /
                                              staycoef);
  }

  // possibly tighten bounds of the column that stays
  bool lowerTightened = stayImplLower > oldStayLower + primal_feastol;
  if (lowerTightened) changeColLower(staycol, stayImplLower);

  bool upperTightened = stayImplUpper < oldStayUpper - primal_feastol;
  if (upperTightened) changeColUpper(staycol, stayImplUpper);

  postsolve_stack.doubletonEquation(
      row, substcol, staycol, substcoef, staycoef, rhs, substLower, substUpper,
      model->col_cost_[substcol], lowerTightened, upperTightened, rowType,
      getColumnVector(substcol));

  // finally modify matrix
  markColDeleted(substcol);
  removeRow(row);
  substitute(substcol, staycol, rhs / substcoef, -staycoef / substcoef);

  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleDoubletonEquation);

  // since a column was deleted we might have new row singletons which we
  // immediately remove
  HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));

  return checkLimits(postsolve_stack);
}